

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkmanagerservice.cpp
# Opt level: O3

int __thiscall
QNetworkManagerInterface::qt_metacall(QNetworkManagerInterface *this,Call _c,int _id,void **_a)

{
  int iVar1;
  QStringList *invalidatedProperties;
  undefined4 in_register_00000014;
  Call CVar2;
  undefined4 in_register_00000034;
  QNetworkManagerInterface *_t;
  
  invalidatedProperties = (QStringList *)_a;
  CVar2 = _c;
  iVar1 = QDBusAbstractInterface::qt_metacall
                    ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return iVar1;
      }
      if (iVar1 == 0) {
        setProperties(this,(QString *)CONCAT44(in_register_00000034,CVar2),
                      (QMap<QString,_QVariant> *)_a[2],invalidatedProperties);
      }
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QNetworkManagerInterface::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkManagerInterfaceBase::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}